

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O1

void __thiscall GrpParser::glyphSpec(GrpParser *this)

{
  ASTFactory *pAVar1;
  bool bVar2;
  int iVar3;
  RefAST RVar4;
  NoViableAltException *pNVar5;
  RefAST *this_00;
  factory_type *this_01;
  RefAST tmp104_AST;
  RefAST tmp101_AST;
  ASTPair currentAST;
  RefAST glyphSpec_AST;
  ASTFactory local_e8;
  ASTPair local_d8;
  ASTFactory local_c8;
  RefAST *local_b8;
  RefCount<Token> local_b0;
  RefCount<Token> local_a8;
  RefCount<Token> local_a0;
  RefToken local_98;
  RefToken local_90;
  RefAST local_88;
  RefToken local_80;
  RefAST local_78;
  RefAST local_70;
  RefAST local_68;
  RefAST local_60;
  RefAST local_58;
  RefAST local_50;
  RefAST local_48;
  RefCount<Token> local_40;
  RefAST local_38;
  
  local_b8 = &(this->super_LLkParser).super_Parser.returnAST;
  RefCount<AST>::operator=(local_b8,&nullAST);
  local_c8.nodeFactory = (factory_type)nullAST;
  local_d8.root.ref = (Ref *)0x0;
  local_d8.child.ref = (Ref *)0x0;
  if (nullAST.ref == (Ref *)0x0) {
    local_c8.nodeFactory = (factory_type)0x0;
  }
  else {
    (nullAST.ref)->count = (nullAST.ref)->count + 1;
  }
  iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
  RVar4 = nullAST;
  switch(iVar3) {
  case 0x1a:
    pseudoFunc(this);
    local_78.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_78.ref == (Ref *)0x0) {
      local_78.ref = (Ref *)0x0;
    }
    else {
      (local_78.ref)->count = (local_78.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_d8,&local_78);
    this_01 = (factory_type *)&local_78;
    break;
  case 0x1b:
    unicodeCodepoint(this);
    local_70.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_70.ref == (Ref *)0x0) {
      local_70.ref = (Ref *)0x0;
    }
    else {
      (local_70.ref)->count = (local_70.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_d8,&local_70);
    this_01 = (factory_type *)&local_70;
    break;
  case 0x1c:
    codepointFunc(this);
    local_50.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_50.ref == (Ref *)0x0) {
      local_50.ref = (Ref *)0x0;
    }
    else {
      (local_50.ref)->count = (local_50.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_d8,&local_50);
    this_01 = (factory_type *)&local_50;
    break;
  case 0x1d:
    glyphidFunc(this);
    local_58.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_58.ref == (Ref *)0x0) {
      local_58.ref = (Ref *)0x0;
    }
    else {
      (local_58.ref)->count = (local_58.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_d8,&local_58);
    this_01 = (factory_type *)&local_58;
    break;
  case 0x1e:
    postscriptFunc(this);
    local_60.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_60.ref == (Ref *)0x0) {
      local_60.ref = (Ref *)0x0;
    }
    else {
      (local_60.ref)->count = (local_60.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_d8,&local_60);
    this_01 = (factory_type *)&local_60;
    break;
  case 0x1f:
    unicodeFunc(this);
    local_68.ref = (this->super_LLkParser).super_Parser.returnAST.ref;
    if (local_68.ref == (Ref *)0x0) {
      local_68.ref = (Ref *)0x0;
    }
    else {
      (local_68.ref)->count = (local_68.ref)->count + 1;
    }
    ASTFactory::addASTChild(&(this->super_LLkParser).super_Parser.astFactory,&local_d8,&local_68);
    this_01 = (factory_type *)&local_68;
    break;
  default:
    if (iVar3 == 6) {
      if (nullAST.ref == (Ref *)0x0) {
        RVar4.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_e8.nodeFactory = (factory_type)RVar4.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a8,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create(&local_e8,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_e8.nodeFactory,(RefCount<AST> *)&local_e8);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_e8);
      RefCount<Token>::~RefCount(&local_a8);
      Parser::match((Parser *)this,6);
      iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
      if ((iVar3 - 0x1aU < 6) || (iVar3 == 6)) {
LAB_00197833:
        glyphSpec(this);
        local_38.ref = local_b8->ref;
        if (local_38.ref == (Ref *)0x0) {
          local_38.ref = (Ref *)0x0;
        }
        else {
          (local_38.ref)->count = (local_38.ref)->count + 1;
        }
        ASTFactory::addASTChild(pAVar1,&local_d8,&local_38);
        this_00 = &local_38;
        while( true ) {
          RefCount<AST>::~RefCount(this_00);
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          bVar2 = BitSet::member(&_tokenSet_27,iVar3);
          if (!bVar2) break;
          iVar3 = (*(this->super_LLkParser).super_Parser._vptr_Parser[4])(this,1);
          RVar4 = nullAST;
          if (((5 < iVar3 - 0x1aU) && (iVar3 != 6)) && (iVar3 != 0xd)) {
            if (iVar3 != 0x15) {
              pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
              (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_80,this,1);
              NoViableAltException::NoViableAltException(pNVar5,&local_80);
              __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                          NoViableAltException::~NoViableAltException);
            }
            if (nullAST.ref == (Ref *)0x0) {
              RVar4.ref = (Ref *)0x0;
            }
            else {
              (nullAST.ref)->count = (nullAST.ref)->count + 1;
            }
            local_e8._vptr_ASTFactory = (_func_int **)RVar4.ref;
            (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_40,this,1);
            ASTFactory::create(&local_c8,(RefToken *)pAVar1);
            RefCount<AST>::operator=((RefCount<AST> *)&local_e8,(RefCount<AST> *)&local_c8);
            RefCount<AST>::~RefCount((RefCount<AST> *)&local_c8);
            RefCount<Token>::~RefCount(&local_40);
            Parser::match((Parser *)this,0x15);
            RefCount<AST>::~RefCount((RefCount<AST> *)&local_e8);
          }
          glyphSpec(this);
          local_88.ref = local_b8->ref;
          if (local_88.ref == (Ref *)0x0) {
            local_88.ref = (Ref *)0x0;
          }
          else {
            (local_88.ref)->count = (local_88.ref)->count + 1;
          }
          ASTFactory::addASTChild(pAVar1,&local_d8,&local_88);
          this_00 = &local_88;
        }
      }
      else if (iVar3 != 7) {
        if (iVar3 != 0xd) {
          pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
          (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_90,this,1);
          NoViableAltException::NoViableAltException(pNVar5,&local_90);
          __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                      NoViableAltException::~NoViableAltException);
        }
        goto LAB_00197833;
      }
      local_e8._vptr_ASTFactory = (_func_int **)nullAST.ref;
      if (nullAST.ref == (Ref *)0x0) {
        local_e8._vptr_ASTFactory = (_func_int **)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_b0,this,1);
      ASTFactory::create(&local_c8,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_e8,(RefCount<AST> *)&local_c8);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_c8);
      RefCount<Token>::~RefCount(&local_b0);
      Parser::match((Parser *)this,7);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_e8);
    }
    else {
      if (iVar3 != 0xd) {
        pNVar5 = (NoViableAltException *)__cxa_allocate_exception(0x40);
        (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_98,this,1);
        NoViableAltException::NoViableAltException(pNVar5,&local_98);
        __cxa_throw(pNVar5,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      if (nullAST.ref == (Ref *)0x0) {
        RVar4.ref = (Ref *)0x0;
      }
      else {
        (nullAST.ref)->count = (nullAST.ref)->count + 1;
      }
      local_e8.nodeFactory = (factory_type)RVar4.ref;
      (*(this->super_LLkParser).super_Parser._vptr_Parser[5])(&local_a0,this,1);
      pAVar1 = &(this->super_LLkParser).super_Parser.astFactory;
      ASTFactory::create(&local_e8,(RefToken *)pAVar1);
      RefCount<AST>::operator=((RefCount<AST> *)&local_e8.nodeFactory,(RefCount<AST> *)&local_e8);
      RefCount<AST>::~RefCount((RefCount<AST> *)&local_e8);
      RefCount<Token>::~RefCount(&local_a0);
      if ((Ref *)local_e8.nodeFactory == (Ref *)0x0) {
        local_48.ref = (Ref *)0x0;
      }
      else {
        *(uint *)((long)local_e8.nodeFactory + 8) = *(uint *)((long)local_e8.nodeFactory + 8) + 1;
        local_48.ref = (Ref *)local_e8.nodeFactory;
      }
      ASTFactory::addASTChild(pAVar1,&local_d8,&local_48);
      RefCount<AST>::~RefCount(&local_48);
      Parser::match((Parser *)this,0xd);
    }
    this_01 = &local_e8.nodeFactory;
  }
  RefCount<AST>::~RefCount((RefCount<AST> *)this_01);
  RefCount<AST>::operator=((RefCount<AST> *)&local_c8.nodeFactory,&local_d8.root);
  RefCount<AST>::operator=(local_b8,(RefCount<AST> *)&local_c8.nodeFactory);
  RefCount<AST>::~RefCount((RefCount<AST> *)&local_c8.nodeFactory);
  RefCount<AST>::~RefCount(&local_d8.child);
  RefCount<AST>::~RefCount(&local_d8.root);
  return;
}

Assistant:

void GrpParser::glyphSpec() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphSpec_AST = nullAST;
	
	try {      // for error handling
		{
		switch ( LA(1)) {
		case IDENT:
		{
			RefAST tmp101_AST = nullAST;
			tmp101_AST = astFactory.create(LT(1));
			astFactory.addASTChild(currentAST, tmp101_AST);
			match(IDENT);
			break;
		}
		case LITERAL_codepoint:
		{
			codepointFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_glyphid:
		{
			glyphidFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_postscript:
		{
			postscriptFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_unicode:
		{
			unicodeFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LIT_UHEX:
		{
			unicodeCodepoint();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case LITERAL_pseudo:
		{
			pseudoFunc();
			astFactory.addASTChild(currentAST, returnAST);
			break;
		}
		case OP_LPAREN:
		{
			{
			RefAST tmp102_AST = nullAST;
			tmp102_AST = astFactory.create(LT(1));
			match(OP_LPAREN);
			{
			switch ( LA(1)) {
			case OP_LPAREN:
			case IDENT:
			case LITERAL_pseudo:
			case LIT_UHEX:
			case LITERAL_codepoint:
			case LITERAL_glyphid:
			case LITERAL_postscript:
			case LITERAL_unicode:
			{
				glyphSpec();
				astFactory.addASTChild(currentAST, returnAST);
				{
				do {
					if ((_tokenSet_27.member(LA(1)))) {
						{
						switch ( LA(1)) {
						case OP_COMMA:
						{
							RefAST tmp103_AST = nullAST;
							tmp103_AST = astFactory.create(LT(1));
							match(OP_COMMA);
							break;
						}
						case OP_LPAREN:
						case IDENT:
						case LITERAL_pseudo:
						case LIT_UHEX:
						case LITERAL_codepoint:
						case LITERAL_glyphid:
						case LITERAL_postscript:
						case LITERAL_unicode:
						{
							break;
						}
						default:
						{
							throw NoViableAltException(LT(1));
						}
						}
						}
						glyphSpec();
						astFactory.addASTChild(currentAST, returnAST);
					}
					else {
						goto _loop88;
					}
					
				} while (true);
				_loop88:;
				}
				break;
			}
			case OP_RPAREN:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp104_AST = nullAST;
			tmp104_AST = astFactory.create(LT(1));
			match(OP_RPAREN);
			}
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphSpec_AST = currentAST.root;
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_28);
	}
	returnAST = glyphSpec_AST;
}